

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_socket.c
# Opt level: O1

void oonf_socket_add(oonf_socket_entry *entry)

{
  list_entity **pplVar1;
  undefined1 local_18 [16];
  
  if ((log_global_mask[_oonf_socket_subsystem.logging] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,_oonf_socket_subsystem.logging,"src/base/oonf_socket.c",0x91,
             (void *)0x0,0,"Adding socket entry %s (%d) to scheduler\n",entry->name,
             (ulong)(uint)(entry->fd).fd);
  }
  (entry->_node).next = &_socket_head;
  (entry->_node).prev = _socket_head.prev;
  pplVar1 = &(_socket_head.prev)->next;
  _socket_head.prev = &entry->_node;
  *pplVar1 = &entry->_node;
  local_18._4_8_ = &entry->fd;
  local_18._0_4_ = 0;
  epoll_ctl(_socket_events._epoll_fd,1,(entry->fd).fd,(epoll_event *)local_18);
  return;
}

Assistant:

void
oonf_socket_add(struct oonf_socket_entry *entry) {
  OONF_DEBUG(LOG_SOCKET, "Adding socket entry %s (%d) to scheduler\n", entry->name, os_fd_get_fd(&entry->fd));

  list_add_before(&_socket_head, &entry->_node);
  os_fd_event_socket_add(&_socket_events, &entry->fd);
}